

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

QString * QMakeEvaluator::formatValueListList(QList<ProStringList> *lists)

{
  QLatin1StringView s;
  bool bVar1;
  const_iterator o;
  ProStringList *pPVar2;
  ProStringList *in_RSI;
  QList<ProStringList> *in_RDI;
  long in_FS_OFFSET;
  ProStringList *list;
  QList<ProStringList> *__range1;
  QString *ret;
  const_iterator __end1;
  const_iterator __begin1;
  QString *in_stack_ffffffffffffff78;
  QList<ProStringList> *s_00;
  undefined7 uVar3;
  undefined1 commas;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (ProStringList *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  s_00 = in_RDI;
  QString::QString((QString *)0x2fe79d);
  local_10.i = (ProStringList *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<ProStringList>::begin(in_RDI);
  o = QList<ProStringList>::end(in_RDI);
  while (bVar1 = QList<ProStringList>::const_iterator::operator!=(&local_10,o), bVar1) {
    pPVar2 = QList<ProStringList>::const_iterator::operator*(&local_10);
    uVar3 = SUB87(pPVar2,0);
    commas = (undefined1)((ulong)pPVar2 >> 0x38);
    bVar1 = QString::isEmpty((QString *)0x2fe836);
    if (!bVar1) {
      QLatin1String::QLatin1String((QLatin1String *)CONCAT17(commas,uVar3),(char *)s_00);
      s.m_size._7_1_ = commas;
      s.m_size._0_7_ = uVar3;
      s.m_data = (char *)in_RSI;
      QString::operator+=(in_stack_ffffffffffffff78,s);
    }
    formatValueList(in_RSI,(bool)commas);
    QString::operator+=((QString *)in_RDI,in_stack_ffffffffffffff78);
    QString::~QString((QString *)0x2fe889);
    QList<ProStringList>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)s_00;
}

Assistant:

QString QMakeEvaluator::formatValueListList(const QList<ProStringList> &lists)
{
    QString ret;

    for (const ProStringList &list : lists) {
        if (!ret.isEmpty())
            ret += QLatin1String(", ");
        ret += formatValueList(list);
    }
    return ret;
}